

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

bool __thiscall QFileDialog::restoreState(QFileDialog *this,QByteArray *state)

{
  bool bVar1;
  QFileDialogPrivate *pQVar2;
  ulong uVar3;
  QDataStream *this_00;
  QUrl *in_RDI;
  long in_FS_OFFSET;
  QFileDialogPrivate *d;
  QString currentDirectoryString;
  qint32 viewMode;
  qint32 v;
  qint32 marker;
  QUrl currentDirectory;
  QStringList history;
  QByteArray sd;
  QDataStream stream;
  undefined4 in_stack_ffffffffffffff28;
  ViewMode in_stack_ffffffffffffff2c;
  QDataStream *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  bool local_99;
  QUrl local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  int local_74;
  int local_70;
  int local_6c;
  undefined1 local_68 [12];
  int splitterPosition;
  QStringList *history_00;
  QFileDialogPrivate *this_01;
  uint local_44;
  QByteArray local_40;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QFileDialog *)0x74f1d5);
  local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray
            ((QByteArray *)in_stack_ffffffffffffff30,
             (QByteArray *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff2c);
  QDataStream::QDataStream((QDataStream *)&local_28,&local_40,(QFlags_conflict1 *)(ulong)local_44);
  QDataStream::setVersion((QDataStream *)&local_28,0xd);
  uVar3 = QDataStream::atEnd();
  if ((uVar3 & 1) == 0) {
    splitterPosition = -0x55555556;
    history_00 = (QStringList *)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = (QFileDialogPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)0x74f2ee);
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl((QUrl *)local_68);
    local_6c = -0x55555556;
    local_70 = -0x55555556;
    local_74 = -0x55555556;
    QDataStream::operator>>((QDataStream *)&local_28,&local_6c);
    QDataStream::operator>>((QDataStream *)&local_28,&local_70);
    if ((local_6c == 0xbe) && ((local_70 == 3 || (local_70 == 4)))) {
      ::operator>>((QDataStream *)&local_28,&pQVar2->splitterState);
      ::operator>>(in_stack_ffffffffffffff30,
                   (QList<QUrl> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      ::operator>>(in_stack_ffffffffffffff30,
                   (QList<QString> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (local_70 == 3) {
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x74f3d9);
        ::operator>>((QDataStream *)&local_28,(QString *)&local_90);
        QUrl::fromLocalFile((QString *)&local_98);
        QUrl::operator=((QUrl *)in_stack_ffffffffffffff30,
                        (QUrl *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        QUrl::~QUrl(&local_98);
        QString::~QString((QString *)0x74f41d);
      }
      else {
        ::operator>>((QDataStream *)&local_28,(QUrl *)local_68);
      }
      this_00 = (QDataStream *)::operator>>((QDataStream *)&local_28,&pQVar2->headerData);
      QDataStream::operator>>(this_00,&local_74);
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
      operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                  *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      uVar3 = QUrl::isEmpty();
      if ((uVar3 & 1) == 0) {
        pQVar2 = (QFileDialogPrivate *)
                 QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                 ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                               *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      else {
        pQVar2 = (QFileDialogPrivate *)local_68;
      }
      setDirectoryUrl((QFileDialog *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      in_RDI);
      setViewMode((QFileDialog *)pQVar2,in_stack_ffffffffffffff2c);
      bVar1 = QFileDialogPrivate::usingWidgets(pQVar2);
      if (bVar1) {
        local_99 = QFileDialogPrivate::restoreWidgetState(this_01,history_00,splitterPosition);
      }
      else {
        local_99 = true;
      }
    }
    else {
      local_99 = false;
    }
    QUrl::~QUrl((QUrl *)local_68);
    QList<QString>::~QList((QList<QString> *)0x74f4fe);
  }
  else {
    local_99 = false;
  }
  QDataStream::~QDataStream((QDataStream *)&local_28);
  QByteArray::~QByteArray((QByteArray *)0x74f518);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_99;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDialog::restoreState(const QByteArray &state)
{
    Q_D(QFileDialog);
    QByteArray sd = state;
    QDataStream stream(&sd, QIODevice::ReadOnly);
    stream.setVersion(QDataStream::Qt_5_0);
    if (stream.atEnd())
        return false;
    QStringList history;
    QUrl currentDirectory;
    qint32 marker;
    qint32 v;
    qint32 viewMode;
    stream >> marker;
    stream >> v;
    // the code below only supports versions 3 and 4
    if (marker != QFileDialogMagic || (v != 3 && v != 4))
        return false;

    stream >> d->splitterState
           >> d->sidebarUrls
           >> history;
    if (v == 3) {
        QString currentDirectoryString;
        stream >> currentDirectoryString;
        currentDirectory = QUrl::fromLocalFile(currentDirectoryString);
    } else {
        stream >> currentDirectory;
    }
    stream >> d->headerData
           >> viewMode;

    setDirectoryUrl(lastVisitedDir()->isEmpty() ? currentDirectory : *lastVisitedDir());
    setViewMode(static_cast<QFileDialog::ViewMode>(viewMode));

    if (!d->usingWidgets())
        return true;

    return d->restoreWidgetState(history, -1);
}